

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::CreateSymlink(string *origName,string *newName,string *errorMessage)

{
  int err;
  char *__rhs;
  string e;
  uv_fs_t req;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  uv_fs_t local_1d8;
  
  err = uv_fs_symlink((uv_loop_t *)0x0,&local_1d8,(origName->_M_dataplus)._M_p,
                      (newName->_M_dataplus)._M_p,0,(uv_fs_cb)0x0);
  if (err != 0) {
    std::operator+(&local_1f8,"failed to create symbolic link \'",newName);
    std::operator+(&local_218,&local_1f8,"\': ");
    __rhs = uv_strerror(err);
    std::operator+(&bStack_238,&local_218,__rhs);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    if (errorMessage == (string *)0x0) {
      Error(&bStack_238);
    }
    else {
      std::__cxx11::string::operator=((string *)errorMessage,(string *)&bStack_238);
    }
    std::__cxx11::string::~string((string *)&bStack_238);
  }
  return err == 0;
}

Assistant:

bool cmSystemTools::CreateSymlink(const std::string& origName,
                                  const std::string& newName,
                                  std::string* errorMessage)
{
  uv_fs_t req;
  int flags = 0;
#if defined(_WIN32)
  if (cmsys::SystemTools::FileIsDirectory(origName)) {
    flags |= UV_FS_SYMLINK_DIR;
  }
#endif
  int err = uv_fs_symlink(nullptr, &req, origName.c_str(), newName.c_str(),
                          flags, nullptr);
  if (err) {
    std::string e =
      "failed to create symbolic link '" + newName + "': " + uv_strerror(err);
    if (errorMessage) {
      *errorMessage = std::move(e);
    } else {
      cmSystemTools::Error(e);
    }
    return false;
  }

  return true;
}